

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
               (Matrix33<double> *A,Vec3<double> *V)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  Vec3<double> *in_RSI;
  Vec3<double> *pVVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  uint i_1;
  uint i;
  int maxIdx;
  Matrix33<double> MV;
  Vec3<double> S;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff8c;
  uint i_00;
  Matrix33<double> *in_stack_ffffffffffffff90;
  Vec3<double> local_28;
  Vec3<double> *local_10;
  
  local_10 = in_RSI;
  Vec3<double>::Vec3(&local_28);
  Matrix33<double>::Matrix33((Matrix33<double> *)&stack0xffffffffffffff90);
  jacobiEigenSolver<double>
            (in_stack_ffffffffffffff90,
             (Vec3<double> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (Matrix33<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec3<double>::dimensions();
    if (uVar2 <= uVar6) break;
    pVVar4 = &local_28;
    Vec3<double>::operator[](pVVar4,uVar5);
    std::abs((int)pVVar4);
    pVVar4 = &local_28;
    Vec3<double>::operator[](pVVar4,i_00);
    std::abs((int)pVVar4);
    if (extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
      i_00 = uVar5;
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec3<double>::dimensions();
    if (uVar2 <= uVar6) break;
    pdVar3 = Matrix33<double>::operator[]((Matrix33<double> *)&stack0xffffffffffffff90,uVar5);
    dVar1 = pdVar3[(int)i_00];
    pdVar3 = Vec3<double>::operator[](local_10,uVar5);
    *pdVar3 = dVar1;
    uVar6 = uVar5 + 1;
  }
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int maxIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) > std::abs (S[maxIdx])) maxIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][maxIdx];
}